

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzerSettings.cpp
# Opt level: O0

bool __thiscall
SimpleParallelAnalyzerSettings::SetSettingsFromInterfaces(SimpleParallelAnalyzerSettings *this)

{
  byte bVar1;
  size_type sVar2;
  reference pvVar3;
  reference this_00;
  double dVar4;
  Channel local_d8 [16];
  char local_c8 [8];
  char text [64];
  uint local_7c;
  Channel local_78 [4];
  U32 i_2;
  Channel local_68 [16];
  uint local_58;
  U32 i_1;
  Channel local_48 [16];
  Channel local_38 [20];
  uint local_24;
  int local_20;
  U32 i;
  U32 num_used_channels;
  U32 count;
  SimpleParallelAnalyzerSettings *this_local;
  
  _num_used_channels = this;
  sVar2 = std::vector<Channel,_std::allocator<Channel>_>::size(&this->mDataChannels);
  i = (U32)sVar2;
  local_20 = 0;
  for (local_24 = 0; local_24 < i; local_24 = local_24 + 1) {
    std::
    vector<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>::
    operator[](&this->mDataChannelsInterface,(ulong)local_24);
    AnalyzerSettingInterfaceChannel::GetChannel();
    Channel::Channel(local_48,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    bVar1 = Channel::operator!=(local_38,local_48);
    Channel::~Channel(local_48);
    Channel::~Channel(local_38);
    if ((bVar1 & 1) != 0) {
      local_20 = local_20 + 1;
    }
  }
  if (local_20 == 0) {
    AnalyzerSettings::SetErrorText((char *)this);
    this_local._7_1_ = false;
  }
  else {
    for (local_58 = 0; local_58 < i; local_58 = local_58 + 1) {
      std::
      vector<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
      ::operator[](&this->mDataChannelsInterface,(ulong)local_58);
      AnalyzerSettingInterfaceChannel::GetChannel();
      pvVar3 = std::vector<Channel,_std::allocator<Channel>_>::operator[]
                         (&this->mDataChannels,(ulong)local_58);
      Channel::operator=(pvVar3,local_68);
      Channel::~Channel(local_68);
    }
    std::
    unique_ptr<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
    ::operator->(&this->mClockChannelInterface);
    AnalyzerSettingInterfaceChannel::GetChannel();
    Channel::operator=(&this->mClockChannel,local_78);
    Channel::~Channel(local_78);
    std::
    unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
    ::operator->(&this->mClockEdgeInterface);
    dVar4 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
    this->mClockEdge = (ParallelAnalyzerClockEdge)(long)dVar4;
    AnalyzerSettings::ClearChannels();
    for (local_7c = 0; local_7c < i; local_7c = local_7c + 1) {
      sprintf(local_c8,"D%d",(ulong)local_7c);
      pvVar3 = std::vector<Channel,_std::allocator<Channel>_>::operator[]
                         (&this->mDataChannels,(ulong)local_7c);
      this_00 = std::vector<Channel,_std::allocator<Channel>_>::operator[]
                          (&this->mDataChannels,(ulong)local_7c);
      Channel::Channel(local_d8,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
      Channel::operator!=(this_00,local_d8);
      AnalyzerSettings::AddChannel((Channel *)this,(char *)pvVar3,SUB81(local_c8,0));
      Channel::~Channel(local_d8);
    }
    AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mClockChannel,true);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SimpleParallelAnalyzerSettings::SetSettingsFromInterfaces()
{
    U32 count = mDataChannels.size();
    U32 num_used_channels = 0;
    for( U32 i = 0; i < count; i++ )
    {
        if( mDataChannelsInterface[ i ]->GetChannel() != UNDEFINED_CHANNEL )
            num_used_channels++;
    }

    if( num_used_channels == 0 )
    {
        SetErrorText( "Please select at least one channel to use in the parallel bus" );
        return false;
    }

    for( U32 i = 0; i < count; i++ )
    {
        mDataChannels[ i ] = mDataChannelsInterface[ i ]->GetChannel();
    }

    mClockChannel = mClockChannelInterface->GetChannel();
    mClockEdge = static_cast<ParallelAnalyzerClockEdge>( U32( mClockEdgeInterface->GetNumber() ) );

    ClearChannels();
    for( U32 i = 0; i < count; i++ )
    {
        char text[ 64 ];
        sprintf( text, "D%d", i );
        AddChannel( mDataChannels[ i ], text, mDataChannels[ i ] != UNDEFINED_CHANNEL );
    }

    AddChannel( mClockChannel, "Clock", true );

    return true;
}